

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

InterpolationType __thiscall
soul::StructuralParser::parseOptionalInterpolationType(StructuralParser *this)

{
  bool bVar1;
  InterpolationType IVar2;
  CompileMessage local_50;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2cada8);
  IVar2 = none;
  if (bVar1) {
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"none");
    IVar2 = none;
    if (!bVar1) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"latch");
      if (bVar1) {
        IVar2 = latch;
      }
      else {
        bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"linear");
        if (bVar1) {
          IVar2 = linear;
        }
        else {
          bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"sinc");
          if (bVar1) {
            IVar2 = sinc;
          }
          else {
            bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                    ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"fast");
            if (bVar1) {
              IVar2 = fast;
            }
            else {
              bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      ::matchIfKeywordOrIdentifier(&this->super_SOULTokeniser,"best");
              if (bVar1) {
                IVar2 = best;
              }
              else {
                Errors::expectedInterpolationType<>();
                (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_50);
                CompileMessage::~CompileMessage(&local_50);
              }
            }
          }
        }
      }
    }
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a0190);
  }
  return IVar2;
}

Assistant:

InterpolationType parseOptionalInterpolationType()
    {
        if (! matchIf (Operator::openBracket))
            return InterpolationType::none;

        auto type = parseInterpolationType (*this);
        expect (Operator::closeBracket);
        return type;
    }